

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_524108::QPDFWordTokenFinder::~QPDFWordTokenFinder(QPDFWordTokenFinder *this)

{
  ~QPDFWordTokenFinder(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~QPDFWordTokenFinder() override = default;